

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureFilterMinmaxUtils::SupportedTextureType::SupportedTextureType
          (SupportedTextureType *this,GLenum type,string *shaderTexcoordType,
          string *shaderSamplerType)

{
  string *str;
  SupportedTextureType *pSVar1;
  allocator<char> local_49;
  
  this->_vptr_SupportedTextureType = (_func_int **)&PTR___cxa_pure_virtual_01dd20e0;
  this->m_type = type;
  tcu::Vector<int,_3>::Vector(&this->m_size);
  (this->m_vertexShader)._M_dataplus._M_p = (pointer)&(this->m_vertexShader).field_2;
  (this->m_vertexShader)._M_string_length = 0;
  (this->m_vertexShader).field_2._M_local_buf[0] = '\0';
  str = &this->m_fragmentShader;
  (this->m_fragmentShader)._M_dataplus._M_p = (pointer)&(this->m_fragmentShader).field_2;
  (this->m_fragmentShader)._M_string_length = 0;
  (this->m_fragmentShader).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&this->m_vertexShader);
  std::__cxx11::string::assign((char *)str);
  pSVar1 = (SupportedTextureType *)&stack0xffffffffffffffb8;
  std::__cxx11::string::string<std::allocator<char>>((string *)pSVar1,"<texcoord_type>",&local_49);
  replaceAll(pSVar1,&this->m_vertexShader,(string *)&stack0xffffffffffffffb8,shaderTexcoordType);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  pSVar1 = (SupportedTextureType *)&stack0xffffffffffffffb8;
  std::__cxx11::string::string<std::allocator<char>>((string *)pSVar1,"<texcoord_type>",&local_49);
  replaceAll(pSVar1,str,(string *)&stack0xffffffffffffffb8,shaderTexcoordType);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  pSVar1 = (SupportedTextureType *)&stack0xffffffffffffffb8;
  std::__cxx11::string::string<std::allocator<char>>((string *)pSVar1,"<sampler_type>",&local_49);
  replaceAll(pSVar1,str,(string *)&stack0xffffffffffffffb8,shaderSamplerType);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

TextureFilterMinmaxUtils::SupportedTextureType::SupportedTextureType(glw::GLenum		type,
																	 const std::string& shaderTexcoordType,
																	 const std::string& shaderSamplerType)
	: m_type(type)
{
	m_vertexShader = "#version 450 core\n"
					 "in highp vec2 position;\n"
					 "in <texcoord_type> inTexcoord;\n"
					 "out <texcoord_type> texcoord;\n"
					 "void main()\n"
					 "{\n"
					 "	texcoord = inTexcoord;\n"
					 "	gl_Position = vec4(position, 0.0, 1.0);\n"
					 "}\n";

	m_fragmentShader = "#version 450 core\n"
					   "uniform <sampler_type> sampler;\n"
					   "in <texcoord_type> texcoord;\n"
					   "out vec4 color;\n"
					   "void main()\n"
					   "{\n"
					   "	color = texture(sampler, texcoord);\n"
					   "}\n";

	replaceAll(m_vertexShader, "<texcoord_type>", shaderTexcoordType);
	replaceAll(m_fragmentShader, "<texcoord_type>", shaderTexcoordType);
	replaceAll(m_fragmentShader, "<sampler_type>", shaderSamplerType);
}